

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddPort.c
# Opt level: O0

DdNode * Cudd_zddPortToBdd(DdManager *dd,DdNode *f)

{
  DdNode *pDVar1;
  DdNode *res;
  DdNode *f_local;
  DdManager *dd_local;
  
  do {
    dd->reordered = 0;
    pDVar1 = zddPortToBddStep(dd,f,0);
  } while (dd->reordered == 1);
  return pDVar1;
}

Assistant:

DdNode *
Cudd_zddPortToBdd(
  DdManager * dd,
  DdNode * f)
{
    DdNode *res;

    do {
        dd->reordered = 0;
        res = zddPortToBddStep(dd,f,0);
    } while (dd->reordered == 1);

    return(res);

}